

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

void cleanup_world(void)

{
  level *plVar1;
  level_conflict *old;
  level *p;
  
  p = world;
  if (world != (level *)0x0) {
    do {
      string_free(p->name);
      string_free(p->up);
      string_free(p->down);
      plVar1 = p->next;
      mem_free(p);
      p = plVar1;
    } while (plVar1 != (level *)0x0);
  }
  return;
}

Assistant:

static void cleanup_world(void)
{
	struct level *level = world;
	while (level) {
		struct level *old = level;
		string_free(level->name);
		string_free(level->up);
		string_free(level->down);
		level = level->next;
		mem_free(old);
	}
}